

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Amap_ManProduceNetwork(Abc_Ntk_t *pNtk,Vec_Ptr_t *vMapping)

{
  int iVar1;
  Mio_Library_t *pLib_00;
  long *plVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  undefined8 *puVar3;
  Mio_Gate_t *pMVar4;
  Abc_Obj_t *pFanin;
  int local_60;
  int nDupGates;
  int iPos;
  int iPis;
  int k;
  int i;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pNodeNew;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodesNew;
  Amap_Out_t *pRes;
  Mio_Library_t *pLib;
  Vec_Ptr_t *vMapping_local;
  Abc_Ntk_t *pNtk_local;
  
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  for (iPis = 0; iVar1 = Vec_PtrSize(vMapping), iPis < iVar1; iPis = iPis + 1) {
    plVar2 = (long *)Vec_PtrEntry(vMapping,iPis);
    if ((*plVar2 != 0) &&
       (pMVar4 = Mio_LibraryReadGateByName(pLib_00,(char *)*plVar2,(char *)0x0),
       pMVar4 == (Mio_Gate_t *)0x0)) {
      Abc_Print(1,"Current library does not contain gate \"%s\".\n",*plVar2);
      return (Abc_Ntk_t *)0x0;
    }
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_MAP);
  pNtk_00->pManFunc = pLib_00;
  local_60 = 0;
  nDupGates = 0;
  iVar1 = Vec_PtrSize(vMapping);
  p = Vec_PtrAlloc(iVar1);
  for (iPis = 0; iVar1 = Vec_PtrSize(vMapping), iPis < iVar1; iPis = iPis + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(vMapping,iPis);
    if (*(short *)(puVar3 + 1) == -1) {
      pFaninNew = Abc_NtkCi(pNtk_00,nDupGates);
      nDupGates = nDupGates + 1;
    }
    else if (*(short *)(puVar3 + 1) == 1) {
      pFaninNew = Abc_NtkCo(pNtk_00,local_60);
      local_60 = local_60 + 1;
    }
    else {
      pFaninNew = Abc_NtkCreateNode(pNtk_00);
      pMVar4 = Mio_LibraryReadGateByName(pLib_00,(char *)*puVar3,(char *)0x0);
      (pFaninNew->field_5).pData = pMVar4;
    }
    for (iPos = 0; iPos < *(short *)((long)puVar3 + 10); iPos = iPos + 1) {
      pFanin = (Abc_Obj_t *)Vec_PtrEntry(p,*(int *)((long)puVar3 + (long)iPos * 4 + 0xc));
      Abc_ObjAddFanin(pFaninNew,pFanin);
    }
    Vec_PtrPush(p,pFaninNew);
  }
  Vec_PtrFree(p);
  iVar1 = Abc_NtkCiNum(pNtk_00);
  if (nDupGates == iVar1) {
    iVar1 = Abc_NtkCoNum(pNtk_00);
    if (local_60 == iVar1) {
      Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
      return pNtk_00;
    }
    __assert_fail("iPos == Abc_NtkCoNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x118e,"Abc_Ntk_t *Amap_ManProduceNetwork(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  __assert_fail("iPis == Abc_NtkCiNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x118d,"Abc_Ntk_t *Amap_ManProduceNetwork(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Ntk_t * Amap_ManProduceNetwork( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMapping )
{
//    extern void * Abc_FrameReadLibGen();
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Amap_Out_t * pRes;
    Vec_Ptr_t * vNodesNew;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNodeNew, * pFaninNew;
    int i, k, iPis, iPos, nDupGates;
    // make sure gates exist in the current library
    Vec_PtrForEachEntry( Amap_Out_t *, vMapping, pRes, i )
        if ( pRes->pName && Mio_LibraryReadGateByName( pLib, pRes->pName, NULL ) == NULL )
        {
            Abc_Print( 1, "Current library does not contain gate \"%s\".\n", pRes->pName );
            return NULL;
        }
    // create the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_MAP );
    pNtkNew->pManFunc = pLib;
    iPis = iPos = 0;
    vNodesNew = Vec_PtrAlloc( Vec_PtrSize(vMapping) );
    Vec_PtrForEachEntry( Amap_Out_t *, vMapping, pRes, i )
    {
        if ( pRes->Type == -1 )
            pNodeNew = Abc_NtkCi( pNtkNew, iPis++ );
        else if ( pRes->Type == 1 )
            pNodeNew = Abc_NtkCo( pNtkNew, iPos++ );
        else
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Mio_LibraryReadGateByName( pLib, pRes->pName, NULL );
        }
        for ( k = 0; k < pRes->nFans; k++ )
        {
            pFaninNew = (Abc_Obj_t *)Vec_PtrEntry( vNodesNew, pRes->pFans[k] );
            Abc_ObjAddFanin( pNodeNew, pFaninNew );
        }
        Vec_PtrPush( vNodesNew, pNodeNew );
    }
    Vec_PtrFree( vNodesNew );
    assert( iPis == Abc_NtkCiNum(pNtkNew) );
    assert( iPos == Abc_NtkCoNum(pNtkNew) );
    // decouple the PO driver nodes to reduce the number of levels
    nDupGates = Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
//    if ( nDupGates && Map_ManReadVerbose(pMan) )
//        Abc_Print( 1, "Duplicated %d gates to decouple the CO drivers.\n", nDupGates );
    return pNtkNew;
}